

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

void __thiscall Cache::setByte(Cache *this,uint32_t addr,uint8_t val,uint32_t *cycles)

{
  uint32_t *puVar1;
  sbyte sVar2;
  bool *pbVar3;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  byte extraout_AL_04;
  byte extraout_AL_05;
  byte extraout_AL_06;
  uint32_t uVar4;
  uint extraout_EAX;
  uint uVar5;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint32_t uVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t *puVar9;
  uint8_t val_00;
  pointer pBVar10;
  ulong uVar11;
  Cache *pCVar12;
  Cache *this_00;
  bool bVar13;
  double __x;
  double dVar14;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  
  this->reference_cnt = this->reference_cnt + 1;
  puVar9 = &(this->statistics).write_cnt;
  *puVar9 = *puVar9 + 1;
  puVar9 = cycles;
  uVar4 = getBlockId(this,addr);
  if (uVar4 != 0xffffffff) {
    log2(__x);
    sVar2 = (extraout_AL < 0x21) * (' ' - extraout_AL);
    puVar9 = &(this->statistics).hit_cnt;
    *puVar9 = *puVar9 + 1;
    puVar9 = &(this->statistics).cycle_cnt;
    *puVar9 = *puVar9 + (this->policy).hit_latency;
    (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
    super__Vector_impl_data._M_start[(int)uVar4].dirty = true;
    PLRUUpdate(this,uVar4);
    pBVar10 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl
              .super__Vector_impl_data._M_start;
    pBVar10[(int)uVar4].last_reference = this->reference_cnt;
    *(uint8_t *)
     (*(long *)&pBVar10[(int)uVar4].data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + (ulong)((addr << sVar2) >> sVar2)) = val;
    if (this->write_back == false) {
      writeBlockToLowerLevel
                (this,(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>
                      ._M_impl.super__Vector_impl_data._M_start + (int)uVar4,cycles);
    }
    if (cycles == (uint32_t *)0x0) {
      return;
    }
    *cycles = *cycles + (this->policy).hit_latency;
    return;
  }
  puVar1 = &(this->statistics).miss_cnt;
  *puVar1 = *puVar1 + 1;
  if (this->write_allocate == false) {
    if (this->lower_cache == (Cache *)0x0) {
      MemoryManager::setByteNoCache(this->memory,addr,val);
      puVar9 = &(this->statistics).cycle_cnt;
      *puVar9 = *puVar9 + 100;
      if (cycles == (uint32_t *)0x0) {
        return;
      }
      *cycles = *cycles + 100;
      return;
    }
    setByte(this->lower_cache,addr,val,cycles);
    if (cycles == (uint32_t *)0x0) {
      return;
    }
    puVar9 = &(this->statistics).cycle_cnt;
    *puVar9 = *puVar9 + *cycles;
    return;
  }
  if (this->bypass != true) goto LAB_00104352;
  dVar14 = log2(__x);
  dVar14 = log2(dVar14);
  sVar2 = (extraout_AL_00 < 0x21) * (' ' - extraout_AL_00);
  uVar4 = (this->policy).associativity;
  uVar5 = (((addr >> (extraout_EAX & 0x1f)) << sVar2) >> sVar2) * uVar4;
  uVar8 = uVar4 + uVar5;
  bVar13 = uVar8 <= uVar5;
  if (bVar13) {
LAB_001041e6:
    if (bVar13) {
      dVar14 = log2(dVar14);
      log2(dVar14);
      uVar4 = getTag(this,addr);
      uVar7 = (ulong)this->mct_size;
      bVar13 = uVar7 != 0;
      if (bVar13) {
        sVar2 = (extraout_AL_01 < 0x21) * (' ' - extraout_AL_01);
        uVar11 = 0;
        do {
          dVar14 = extraout_XMM0_Qa;
          if ((this->mct[((addr >> (extraout_EAX_00 & 0x1f)) << sVar2) >> sVar2][uVar11] ==
               0xffffffffffffffff) ||
             (this->mct[((addr >> (extraout_EAX_00 & 0x1f)) << sVar2) >> sVar2][uVar11] ==
              (ulong)uVar4)) goto LAB_00104323;
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar11);
        bVar13 = uVar11 < uVar7;
      }
      pCVar12 = this->lower_cache;
      if (pCVar12 == (Cache *)0x0) {
        if (cycles != (uint32_t *)0x0) {
          *cycles = *cycles + 100;
        }
        puVar9 = &(this->statistics).cycle_cnt;
        *puVar9 = *puVar9 + 100;
        MemoryManager::setByteNoCache(this->memory,addr,val);
        dVar14 = extraout_XMM0_Qa_01;
      }
      else {
        puVar9 = &(this->statistics).cycle_cnt;
        *puVar9 = *puVar9 + (pCVar12->policy).hit_latency;
        setByte(pCVar12,addr,val,cycles);
        dVar14 = extraout_XMM0_Qa_00;
      }
      dVar14 = log2(dVar14);
      log2(dVar14);
      sVar2 = (extraout_AL_02 < 0x21) * (' ' - extraout_AL_02);
      MCTUpdate(this,((addr >> (extraout_EAX_01 & 0x1f)) << sVar2) >> sVar2,addr);
      dVar14 = extraout_XMM0_Qa_02;
      if (!bVar13) {
        return;
      }
    }
  }
  else {
    pBVar10 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl
              .super__Vector_impl_data._M_start;
    uVar7 = (ulong)uVar5;
    if (pBVar10[uVar7].valid == true) {
      pBVar10 = pBVar10 + uVar7 + 1;
      do {
        uVar7 = uVar7 + 1;
        if (uVar8 == uVar7) break;
        pbVar3 = &pBVar10->valid;
        pBVar10 = pBVar10 + 1;
      } while (*pbVar3 != false);
      bVar13 = uVar8 <= uVar7;
      goto LAB_001041e6;
    }
  }
LAB_00104323:
  dVar14 = log2(dVar14);
  log2(dVar14);
  uVar5 = addr >> (extraout_EAX_02 & 0x1f);
  puVar9 = (uint32_t *)(ulong)uVar5;
  sVar2 = (extraout_AL_03 < 0x21) * (' ' - extraout_AL_03);
  MCTUpdate(this,(uVar5 << sVar2) >> sVar2,addr);
LAB_00104352:
  loadBlockFromLowerLevel(this,addr,cycles);
  if (this->pre_fetch == true) {
    preFetch(this,addr);
  }
  pCVar12 = this;
  uVar4 = addr;
  uVar6 = getBlockId(this,addr);
  if (uVar6 != 0xffffffff) {
    log2(__x_00);
    sVar2 = (extraout_AL_04 < 0x21) * (' ' - extraout_AL_04);
    (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
    super__Vector_impl_data._M_start[(int)uVar6].dirty = true;
    PLRUUpdate(this,uVar6);
    pBVar10 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl
              .super__Vector_impl_data._M_start;
    pBVar10[(int)uVar6].last_reference = this->reference_cnt;
    *(uint8_t *)
     (*(long *)&pBVar10[(int)uVar6].data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + (ulong)((addr << sVar2) >> sVar2)) = val;
    return;
  }
  setByte();
  while( true ) {
    this_00 = pCVar12;
    uVar6 = getBlockId(this_00,uVar4);
    if (uVar6 != 0xffffffff) {
      log2(__x_01);
      sVar2 = (extraout_AL_05 < 0x21) * (' ' - extraout_AL_05);
      pBVar10 = (this_00->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pBVar10[(int)uVar6].dirty = true;
      *(uint8_t *)
       (*(long *)&pBVar10[(int)uVar6].data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + (ulong)((uVar4 << sVar2) >> sVar2)) = val_00;
      if (this_00->write_back != false) {
        return;
      }
      writeBlockToLowerLevel
                (this_00,(this_00->blocks).
                         super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
                         super__Vector_impl_data._M_start + (int)uVar6,puVar9);
      return;
    }
    if (this_00->write_allocate != false) break;
    pCVar12 = this_00->lower_cache;
    if (this_00->lower_cache == (Cache *)0x0) {
      MemoryManager::setByteNoCache(this_00->memory,uVar4,val_00);
      return;
    }
  }
  loadBlockFromLowerLevel(this_00,uVar4,puVar9);
  uVar6 = getBlockId(this_00,uVar4);
  if (uVar6 != 0xffffffff) {
    log2(__x_02);
    sVar2 = (extraout_AL_06 < 0x21) * (' ' - extraout_AL_06);
    pBVar10 = (this_00->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pBVar10[(int)uVar6].dirty = true;
    *(uint8_t *)
     (*(long *)&pBVar10[(int)uVar6].data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + (ulong)((uVar4 << sVar2) >> sVar2)) = val_00;
    return;
  }
  setByteCopy();
  log2(__x_03);
  return;
}

Assistant:

void Cache::setByte(uint32_t addr, uint8_t val, uint32_t *cycles) {
    this->reference_cnt++;
    this->statistics.write_cnt++;
    int block_id;
    if ((block_id = this->getBlockId(addr)) != -1) {
        //in cache
        uint32_t offset = this->getOffset(addr);
        this->statistics.hit_cnt++;
        this->statistics.cycle_cnt += this->policy.hit_latency;
        this->blocks[block_id].dirty = true;
        this->PLRUUpdate(block_id);
        this->blocks[block_id].last_reference = this->reference_cnt;
        this->blocks[block_id].data[offset] = val;
        if (!this->write_back) {
            this->writeBlockToLowerLevel(this->blocks[block_id], cycles);
//            this->statistics.cycle_cnt += this->policy.miss_latency;
        }
        if (cycles) {
            *cycles += this->policy.hit_latency;
        }
        return;
    }

    this->statistics.miss_cnt++;
//    this->statistics.cycle_cnt += this->policy.miss_latency;

    if (!this->write_allocate) {
        if (this->lower_cache == nullptr) {
            this->memory->setByteNoCache(addr, val);
            this->statistics.cycle_cnt += 100;
            if (cycles)
                *cycles += 100;
        } else {
            this->lower_cache->setByte(addr, val, cycles);
            if (cycles)
                this->statistics.cycle_cnt += *cycles;
        }
    } else {
        if (this->bypass) {
            if (this->cacheSetFull(getId(addr))) {
                bool next_level = true;
                uint32_t set_id = getId(addr);
                uint32_t tag = getTag(addr);
                for (int tmp = 0; tmp < this->mct_size; tmp++) {
                    if (mct[set_id][tmp] == (uint64_t) -1 || mct[set_id][tmp] == tag) {
                        next_level = false;
                        break;
                    }
                }
                if (next_level) {
                    if (this->lower_cache == nullptr) {
                        if (cycles)
                            *cycles += 100;
                        this->statistics.cycle_cnt += 100;
                        this->memory->setByteNoCache(addr, val);
                    } else {
                        this->statistics.cycle_cnt += this->lower_cache->policy.hit_latency;
                        this->lower_cache->setByte(addr, val, cycles);
                    }
                    MCTUpdate(getId(addr), addr);
                    return;
                }
            }
            MCTUpdate(getId(addr), addr);
        }
        this->loadBlockFromLowerLevel(addr, cycles);
        if (this->pre_fetch)
            preFetch(addr);
        if ((block_id = this->getBlockId(addr)) != -1) {
            uint32_t offset = this->getOffset(addr);
            this->blocks[block_id].dirty = true;
            this->PLRUUpdate(block_id);
            this->blocks[block_id].last_reference = this->reference_cnt;
            this->blocks[block_id].data[offset] = val;
//            if (cycles)
//                *cycles += this->policy.hit_latency;
            return;
        } else {
            fprintf(stderr, "Error: data should in top level cache, but it seems not\n");
            exit(-1);
        }
    }
}